

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float fVar2;
  BBox1f BVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [12];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined4 uVar37;
  ulong uVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  size_t itime;
  ulong uVar45;
  long lVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar63;
  float fVar72;
  float fVar73;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar74;
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar87;
  float fVar88;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar89;
  float fVar96;
  float fVar97;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar98;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar99;
  float fVar100;
  float fVar111;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar107 [64];
  float fVar116;
  vfloat4 a0;
  float fVar117;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [64];
  float fVar124;
  float fVar125;
  vfloat4 a0_1;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar126;
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  float fVar127;
  float fVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar131 [64];
  float fVar137;
  float fVar141;
  float fVar142;
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar146;
  float fVar149;
  float fVar151;
  undefined1 auVar147 [16];
  float fVar150;
  float fVar152;
  float fVar153;
  undefined1 auVar148 [32];
  float fVar154;
  float fVar157;
  float fVar158;
  Vec3fa n0;
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  float fVar159;
  float fVar162;
  float fVar163;
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  float fVar164;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar170;
  float fVar172;
  float fVar173;
  Vec3fa n1;
  undefined1 auVar171 [16];
  undefined1 auVar174 [32];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  size_t local_300;
  size_t local_2f0;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  ulong local_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  anon_class_16_2_07cfa4d6 local_1c8;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [16];
  undefined1 auStack_108 [16];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [32];
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  local_2b8._8_4_ = 0x7f800000;
  local_2b8._0_8_ = 0x7f8000007f800000;
  local_2b8._12_4_ = 0x7f800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  local_2c8._8_4_ = 0xff800000;
  local_2c8._0_8_ = 0xff800000ff800000;
  local_2c8._12_4_ = 0xff800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar49._8_8_ = 0;
  auVar49._0_4_ =
       (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar49._4_4_ =
       (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar64._8_8_ = 0;
  auVar64._0_4_ = time_range->lower;
  auVar64._4_4_ = time_range->upper;
  auVar57 = vcmpps_avx(auVar49,auVar64,1);
  auVar50 = vinsertps_avx(auVar64,auVar49,0x50);
  auVar49 = vinsertps_avx(auVar49,auVar64,0x50);
  local_1f8 = vblendvps_avx(auVar49,auVar50,auVar57);
  local_208 = vmovshdup_avx(local_1f8);
  if (local_1f8._0_4_ <= local_208._0_4_) {
    uVar45 = r->_begin;
    if (uVar45 < r->_end) {
      local_300 = 0;
      auVar107 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar115 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
      auVar123 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
      local_2e8._8_4_ = 0x7f800000;
      local_2e8._0_8_ = 0x7f8000007f800000;
      local_2e8._12_4_ = 0x7f800000;
      local_2b8._8_4_ = 0x7f800000;
      local_2b8._0_8_ = 0x7f8000007f800000;
      local_2b8._12_4_ = 0x7f800000;
      local_2d8._8_4_ = 0xff800000;
      local_2d8._0_8_ = 0xff800000ff800000;
      local_2d8._12_4_ = 0xff800000;
      local_2c8._8_4_ = 0xff800000;
      local_2c8._0_8_ = 0xff800000ff800000;
      local_2c8._12_4_ = 0xff800000;
      local_2f0 = k;
      do {
        auVar49 = auVar107._0_16_;
        BVar3 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar50._8_8_ = 0;
        auVar50._0_4_ = BVar3.lower;
        auVar50._4_4_ = BVar3.upper;
        auVar57 = vmovshdup_avx(auVar50);
        fVar47 = BVar3.lower;
        fVar48 = auVar57._0_4_ - fVar47;
        uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                   super_CurveGeometry.field_0x68 * uVar45);
        uVar38 = (ulong)(uVar4 + 3);
        pBVar5 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 vertices.items;
        auVar57 = _local_228;
        uVar36 = _local_1e8;
        if (uVar38 < (pBVar5->super_RawBufferView).num) {
          fVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                  super_Geometry.fnumTimeSegments;
          auVar57 = ZEXT416((uint)(fVar2 * (((float)local_1f8._0_4_ - fVar47) / fVar48) * 1.0000002)
                           );
          auVar57 = vroundss_avx(auVar57,auVar57,9);
          auVar57 = vmaxss_avx(auVar49,auVar57);
          auVar64 = ZEXT416((uint)(fVar2 * (((float)local_208._0_4_ - fVar47) / fVar48) * 0.99999976
                                  ));
          auVar64 = vroundss_avx(auVar64,auVar64,10);
          auVar64 = vminss_avx(auVar64,ZEXT416((uint)fVar2));
          if ((uint)(int)auVar57._0_4_ <= (uint)(int)auVar64._0_4_) {
            uVar42 = (ulong)(int)auVar57._0_4_;
            pBVar6 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry
                     .normals.items;
            fVar48 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry
                     .maxRadiusScale;
            _fStack_220 = bezier_basis0._1640_8_;
            local_228 = (undefined1  [8])bezier_basis0._1632_8_;
            auVar57 = _local_228;
            auVar20 = stack0xfffffffffffffddc;
            _fStack_218 = bezier_basis0._1648_8_;
            uVar21 = _fStack_218;
            _fStack_210 = bezier_basis0._1656_8_;
            uVar22 = _fStack_210;
            local_248 = (float)bezier_basis0._2788_8_;
            fStack_244 = SUB84(bezier_basis0._2788_8_,4);
            fStack_240 = (float)bezier_basis0._2796_8_;
            fStack_23c = SUB84(bezier_basis0._2796_8_,4);
            _fStack_238 = bezier_basis0._2804_8_;
            uVar18 = _fStack_238;
            _fStack_230 = bezier_basis0._2812_8_;
            uVar19 = _fStack_230;
            local_198 = (float)bezier_basis0._3944_8_;
            fStack_194 = SUB84(bezier_basis0._3944_8_,4);
            fStack_190 = (float)bezier_basis0._3952_8_;
            fStack_18c = SUB84(bezier_basis0._3952_8_,4);
            _fStack_188 = bezier_basis0._3960_8_;
            uVar30 = _fStack_188;
            _fStack_180 = bezier_basis0._3968_8_;
            uVar31 = _fStack_180;
            fVar47 = SUB84(bezier_basis0._5100_8_,4);
            _local_1e8 = bezier_basis0._5100_8_;
            uVar36 = _local_1e8;
            _fStack_1e0 = bezier_basis0._5108_8_;
            uVar23 = _fStack_1e0;
            _fStack_1d8 = bezier_basis0._5116_8_;
            uVar24 = _fStack_1d8;
            _fStack_1d0 = bezier_basis0._5124_8_;
            uVar25 = _fStack_1d0;
            _local_1b8 = bezier_basis0._6256_8_;
            uVar26 = _local_1b8;
            _fStack_1b0 = bezier_basis0._6264_8_;
            uVar27 = _fStack_1b0;
            _fStack_1a8 = bezier_basis0._6272_8_;
            uVar28 = _fStack_1a8;
            _fStack_1a0 = bezier_basis0._6280_8_;
            uVar29 = _fStack_1a0;
            _local_d8 = bezier_basis0._7412_8_;
            uVar32 = _local_d8;
            _fStack_d0 = bezier_basis0._7420_8_;
            uVar33 = _fStack_d0;
            _fStack_c8 = bezier_basis0._7428_8_;
            uVar34 = _fStack_c8;
            _fStack_c0 = bezier_basis0._7436_8_;
            uVar35 = _fStack_c0;
            local_f8 = (float)bezier_basis0._8568_8_;
            fStack_f4 = SUB84(bezier_basis0._8568_8_,4);
            fStack_f0 = (float)bezier_basis0._8576_8_;
            fStack_ec = SUB84(bezier_basis0._8576_8_,4);
            fStack_e8 = (float)bezier_basis0._8584_8_;
            fStack_e4 = SUB84(bezier_basis0._8584_8_,4);
            fStack_e0 = (float)bezier_basis0._8592_8_;
            uStack_dc = SUB84(bezier_basis0._8592_8_,4);
            lVar43 = uVar42 * 0x38 + 0x10;
            do {
              lVar7 = *(long *)((long)pBVar5 + lVar43 + -0x10);
              lVar8 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar43);
              lVar46 = lVar8 * (ulong)uVar4;
              lVar41 = lVar8 * (ulong)(uVar4 + 1);
              lVar44 = lVar8 * (ulong)(uVar4 + 2);
              auVar50 = vinsertps_avx(ZEXT416(*(uint *)(lVar7 + 0xc + lVar46)),
                                      ZEXT416(*(uint *)(lVar7 + 0xc + lVar41)),0x10);
              auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(lVar7 + 0xc + lVar44)),0x20);
              auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(lVar7 + 0xc + lVar8 * uVar38)),0x30)
              ;
              auVar65._8_4_ = 0x7fffffff;
              auVar65._0_8_ = 0x7fffffff7fffffff;
              auVar65._12_4_ = 0x7fffffff;
              auVar50 = vandps_avx(auVar50,auVar65);
              auVar49 = auVar115._0_16_;
              auVar50 = vcmpps_avx(auVar50,auVar49,5);
              _fStack_238 = uVar18;
              _fStack_230 = uVar19;
              _fStack_218 = uVar21;
              _fStack_210 = uVar22;
              _fStack_1e0 = uVar23;
              _fStack_1d8 = uVar24;
              _fStack_1d0 = uVar25;
              _local_1b8 = uVar26;
              _fStack_1b0 = uVar27;
              _fStack_1a8 = uVar28;
              _fStack_1a0 = uVar29;
              _fStack_188 = uVar30;
              _fStack_180 = uVar31;
              _local_d8 = uVar32;
              _fStack_d0 = uVar33;
              _fStack_c8 = uVar34;
              _fStack_c0 = uVar35;
              if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar50[0xf] < '\0') goto LAB_0121cc99;
              auVar50 = *(undefined1 (*) [16])(lVar7 + lVar46);
              auVar51 = auVar123._0_16_;
              auVar65 = vcmpps_avx(auVar50,auVar51,6);
              auVar81 = vcmpps_avx(auVar50,auVar49,1);
              auVar65 = vandps_avx(auVar65,auVar81);
              uVar37 = vmovmskps_avx(auVar65);
              if ((~(byte)uVar37 & 7) != 0) goto LAB_0121cc99;
              auVar65 = *(undefined1 (*) [16])(lVar7 + lVar41);
              auVar81 = vcmpps_avx(auVar65,auVar51,6);
              auVar54 = vcmpps_avx(auVar65,auVar49,1);
              auVar81 = vandps_avx(auVar81,auVar54);
              uVar37 = vmovmskps_avx(auVar81);
              if ((~(byte)uVar37 & 7) != 0) goto LAB_0121cc99;
              auVar81 = *(undefined1 (*) [16])(lVar7 + lVar44);
              auVar54 = vcmpps_avx(auVar81,auVar51,6);
              auVar52 = vcmpps_avx(auVar81,auVar49,1);
              auVar54 = vandps_avx(auVar54,auVar52);
              uVar37 = vmovmskps_avx(auVar54);
              if ((~(byte)uVar37 & 7) != 0) goto LAB_0121cc99;
              auVar54 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar38);
              auVar52 = vcmpps_avx(auVar54,auVar51,6);
              auVar53 = vcmpps_avx(auVar54,auVar49,1);
              auVar52 = vandps_avx(auVar52,auVar53);
              uVar37 = vmovmskps_avx(auVar52);
              if ((~(byte)uVar37 & 7) != 0) goto LAB_0121cc99;
              lVar7 = *(long *)((long)pBVar6 + lVar43 + -0x10);
              lVar8 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar43);
              auVar52 = *(undefined1 (*) [16])(lVar7 + lVar8 * (ulong)uVar4);
              auVar53 = vcmpps_avx(auVar52,auVar51,6);
              auVar55 = vcmpps_avx(auVar52,auVar49,1);
              auVar53 = vandps_avx(auVar53,auVar55);
              uVar37 = vmovmskps_avx(auVar53);
              if ((~(byte)uVar37 & 7) != 0) goto LAB_0121cc99;
              auVar53 = *(undefined1 (*) [16])(lVar7 + lVar8 * (ulong)(uVar4 + 1));
              auVar51 = vcmpps_avx(auVar53,auVar51,6);
              auVar49 = vcmpps_avx(auVar53,auVar49,1);
              auVar49 = vandps_avx(auVar51,auVar49);
              uVar37 = vmovmskps_avx(auVar49);
              if ((~(byte)uVar37 & 7) != 0) goto LAB_0121cc99;
              auVar49 = vshufps_avx(auVar50,auVar50,0xff);
              auVar50 = vinsertps_avx(auVar50,ZEXT416((uint)(auVar49._0_4_ * fVar48)),0x30);
              auVar49 = vshufps_avx(auVar65,auVar65,0xff);
              auVar49 = vinsertps_avx(auVar65,ZEXT416((uint)(auVar49._0_4_ * fVar48)),0x30);
              auVar65 = vshufps_avx(auVar81,auVar81,0xff);
              auVar65 = vinsertps_avx(auVar81,ZEXT416((uint)(auVar65._0_4_ * fVar48)),0x30);
              auVar81 = vshufps_avx(auVar54,auVar54,0xff);
              auVar81 = vinsertps_avx(auVar54,ZEXT416((uint)(auVar81._0_4_ * fVar48)),0x30);
              pfVar1 = (float *)(lVar7 + lVar8 * (ulong)(uVar4 + 2));
              fVar87 = *pfVar1;
              fVar88 = pfVar1[1];
              fVar89 = pfVar1[2];
              fVar96 = pfVar1[3];
              pfVar1 = (float *)(lVar7 + lVar8 * uVar38);
              fVar97 = *pfVar1;
              fVar98 = pfVar1[1];
              fVar100 = pfVar1[2];
              fVar109 = pfVar1[3];
              fVar99 = auVar81._0_4_;
              fVar108 = auVar81._4_4_;
              fVar110 = auVar81._8_4_;
              fVar116 = fVar110 * auVar131._8_4_;
              fVar111 = auVar81._12_4_;
              fVar117 = fVar111 * auVar131._12_4_;
              fVar126 = auVar65._0_4_;
              fVar128 = auVar65._4_4_;
              fVar133 = auVar65._8_4_;
              fVar135 = auVar65._12_4_;
              fVar63 = auVar49._0_4_;
              fVar73 = auVar49._4_4_;
              fVar127 = auVar49._8_4_;
              fVar134 = auVar49._12_4_;
              fVar72 = auVar50._0_4_;
              fVar74 = auVar50._4_4_;
              fVar132 = auVar50._8_4_;
              fVar136 = auVar50._12_4_;
              local_328._0_4_ =
                   fVar72 * 0.16666667 + fVar63 * 0.6666667 + fVar126 * 0.16666667 + fVar99 * 0.0;
              local_328._4_4_ =
                   fVar74 * 0.16666667 + fVar73 * 0.6666667 + fVar128 * 0.16666667 + fVar108 * 0.0;
              fStack_320 = fVar132 * 0.16666667 +
                           fVar127 * 0.6666667 + fVar133 * 0.16666667 + fVar116;
              fStack_31c = fVar136 * 0.16666667 +
                           fVar134 * 0.6666667 + fVar135 * 0.16666667 + fVar117;
              auVar112._0_4_ = fVar126 * 0.5 + fVar99 * 0.0;
              auVar112._4_4_ = fVar128 * 0.5 + fVar108 * 0.0;
              auVar112._8_4_ = fVar133 * 0.5 + fVar116;
              auVar112._12_4_ = fVar135 * 0.5 + fVar117;
              auVar118._0_4_ = fVar63 * 0.0;
              auVar118._4_4_ = fVar73 * 0.0;
              auVar118._8_4_ = fVar127 * 0.0;
              auVar118._12_4_ = fVar134 * 0.0;
              auVar50 = vsubps_avx(auVar112,auVar118);
              auVar119._0_4_ = fVar72 * 0.5;
              auVar119._4_4_ = fVar74 * 0.5;
              auVar119._8_4_ = fVar132 * 0.5;
              auVar119._12_4_ = fVar136 * 0.5;
              auVar56 = vsubps_avx(auVar50,auVar119);
              fVar137 = auVar53._0_4_;
              fVar141 = auVar53._4_4_;
              fVar142 = auVar53._8_4_;
              fVar146 = auVar53._12_4_;
              fVar116 = auVar52._0_4_;
              fVar117 = auVar52._4_4_;
              fVar124 = auVar52._8_4_;
              fVar125 = auVar52._12_4_;
              auVar113._0_4_ =
                   fVar116 * 0.16666667 + fVar137 * 0.6666667 + fVar87 * 0.16666667 + fVar97 * 0.0;
              auVar113._4_4_ =
                   fVar117 * 0.16666667 + fVar141 * 0.6666667 + fVar88 * 0.16666667 + fVar98 * 0.0;
              auVar113._8_4_ =
                   fVar124 * 0.16666667 + fVar142 * 0.6666667 + fVar89 * 0.16666667 + fVar100 * 0.0;
              auVar113._12_4_ =
                   fVar125 * 0.16666667 + fVar146 * 0.6666667 + fVar96 * 0.16666667 + fVar109 * 0.0;
              auVar120._0_4_ = fVar87 * 0.5 + fVar97 * 0.0;
              auVar120._4_4_ = fVar88 * 0.5 + fVar98 * 0.0;
              auVar120._8_4_ = fVar89 * 0.5 + fVar100 * 0.0;
              auVar120._12_4_ = fVar96 * 0.5 + fVar109 * 0.0;
              auVar129._0_4_ = fVar137 * 0.0;
              auVar129._4_4_ = fVar141 * 0.0;
              auVar129._8_4_ = fVar142 * 0.0;
              auVar129._12_4_ = fVar146 * 0.0;
              auVar50 = vsubps_avx(auVar120,auVar129);
              auVar130._0_4_ = fVar116 * 0.5;
              auVar130._4_4_ = fVar117 * 0.5;
              auVar130._8_4_ = fVar124 * 0.5;
              auVar130._12_4_ = fVar125 * 0.5;
              auVar81 = vsubps_avx(auVar50,auVar130);
              auVar90._0_4_ = fVar72 * 0.0;
              auVar90._4_4_ = fVar74 * 0.0;
              auVar90._8_4_ = fVar132 * 0.0;
              auVar90._12_4_ = fVar136 * 0.0;
              auVar160._0_4_ =
                   auVar90._0_4_ + fVar63 * 0.16666667 + fVar126 * 0.6666667 + fVar99 * 0.16666667;
              auVar160._4_4_ =
                   auVar90._4_4_ + fVar73 * 0.16666667 + fVar128 * 0.6666667 + fVar108 * 0.16666667;
              auVar160._8_4_ =
                   auVar90._8_4_ + fVar127 * 0.16666667 + fVar133 * 0.6666667 + fVar110 * 0.16666667
              ;
              auVar160._12_4_ =
                   auVar90._12_4_ +
                   fVar134 * 0.16666667 + fVar135 * 0.6666667 + fVar111 * 0.16666667;
              auVar101._0_4_ = fVar126 * 0.0 + fVar99 * 0.5;
              auVar101._4_4_ = fVar128 * 0.0 + fVar108 * 0.5;
              auVar101._8_4_ = fVar133 * 0.0 + fVar110 * 0.5;
              auVar101._12_4_ = fVar135 * 0.0 + fVar111 * 0.5;
              auVar76._0_4_ = fVar63 * 0.5;
              auVar76._4_4_ = fVar73 * 0.5;
              auVar76._8_4_ = fVar127 * 0.5;
              auVar76._12_4_ = fVar134 * 0.5;
              auVar50 = vsubps_avx(auVar101,auVar76);
              auVar76 = vsubps_avx(auVar50,auVar90);
              auVar91._0_4_ = fVar116 * 0.0;
              auVar91._4_4_ = fVar117 * 0.0;
              auVar91._8_4_ = fVar124 * 0.0;
              auVar91._12_4_ = fVar125 * 0.0;
              auVar77._0_4_ =
                   auVar91._0_4_ + fVar137 * 0.16666667 + fVar87 * 0.6666667 + fVar97 * 0.16666667;
              auVar77._4_4_ =
                   auVar91._4_4_ + fVar141 * 0.16666667 + fVar88 * 0.6666667 + fVar98 * 0.16666667;
              auVar77._8_4_ =
                   auVar91._8_4_ + fVar142 * 0.16666667 + fVar89 * 0.6666667 + fVar100 * 0.16666667;
              auVar77._12_4_ =
                   auVar91._12_4_ + fVar146 * 0.16666667 + fVar96 * 0.6666667 + fVar109 * 0.16666667
              ;
              auVar51._0_4_ = fVar87 * 0.0 + fVar97 * 0.5;
              auVar51._4_4_ = fVar88 * 0.0 + fVar98 * 0.5;
              auVar51._8_4_ = fVar89 * 0.0 + fVar100 * 0.5;
              auVar51._12_4_ = fVar96 * 0.0 + fVar109 * 0.5;
              auVar66._0_4_ = fVar137 * 0.5;
              auVar66._4_4_ = fVar141 * 0.5;
              auVar66._8_4_ = fVar142 * 0.5;
              auVar66._12_4_ = fVar146 * 0.5;
              auVar50 = vsubps_avx(auVar51,auVar66);
              auVar54 = vsubps_avx(auVar50,auVar91);
              auVar50 = vshufps_avx(auVar56,auVar56,0xc9);
              auVar49 = vshufps_avx(auVar113,auVar113,0xc9);
              fVar142 = auVar56._0_4_;
              auVar92._0_4_ = fVar142 * auVar49._0_4_;
              fVar149 = auVar56._4_4_;
              auVar92._4_4_ = fVar149 * auVar49._4_4_;
              fVar151 = auVar56._8_4_;
              auVar92._8_4_ = fVar151 * auVar49._8_4_;
              fVar153 = auVar56._12_4_;
              auVar92._12_4_ = fVar153 * auVar49._12_4_;
              auVar102._0_4_ = auVar113._0_4_ * auVar50._0_4_;
              auVar102._4_4_ = auVar113._4_4_ * auVar50._4_4_;
              auVar102._8_4_ = auVar113._8_4_ * auVar50._8_4_;
              auVar102._12_4_ = auVar113._12_4_ * auVar50._12_4_;
              auVar49 = vsubps_avx(auVar102,auVar92);
              auVar65 = vshufps_avx(auVar49,auVar49,0xc9);
              auVar49 = vshufps_avx(auVar81,auVar81,0xc9);
              auVar103._0_4_ = fVar142 * auVar49._0_4_;
              auVar103._4_4_ = fVar149 * auVar49._4_4_;
              auVar103._8_4_ = fVar151 * auVar49._8_4_;
              auVar103._12_4_ = fVar153 * auVar49._12_4_;
              auVar52._0_4_ = auVar81._0_4_ * auVar50._0_4_;
              auVar52._4_4_ = auVar81._4_4_ * auVar50._4_4_;
              auVar52._8_4_ = auVar81._8_4_ * auVar50._8_4_;
              auVar52._12_4_ = auVar81._12_4_ * auVar50._12_4_;
              auVar50 = vsubps_avx(auVar52,auVar103);
              auVar81 = vshufps_avx(auVar50,auVar50,0xc9);
              auVar50 = vshufps_avx(auVar76,auVar76,0xc9);
              auVar49 = vshufps_avx(auVar77,auVar77,0xc9);
              fVar164 = auVar76._0_4_;
              auVar53._0_4_ = fVar164 * auVar49._0_4_;
              fVar167 = auVar76._4_4_;
              auVar53._4_4_ = fVar167 * auVar49._4_4_;
              fVar168 = auVar76._8_4_;
              auVar53._8_4_ = fVar168 * auVar49._8_4_;
              fVar169 = auVar76._12_4_;
              auVar53._12_4_ = fVar169 * auVar49._12_4_;
              auVar78._0_4_ = auVar77._0_4_ * auVar50._0_4_;
              auVar78._4_4_ = auVar77._4_4_ * auVar50._4_4_;
              auVar78._8_4_ = auVar77._8_4_ * auVar50._8_4_;
              auVar78._12_4_ = auVar77._12_4_ * auVar50._12_4_;
              auVar49 = vsubps_avx(auVar78,auVar53);
              auVar51 = vshufps_avx(auVar49,auVar49,0xc9);
              auVar49 = vshufps_avx(auVar54,auVar54,0xc9);
              auVar79._0_4_ = fVar164 * auVar49._0_4_;
              auVar79._4_4_ = fVar167 * auVar49._4_4_;
              auVar79._8_4_ = fVar168 * auVar49._8_4_;
              auVar79._12_4_ = fVar169 * auVar49._12_4_;
              auVar67._0_4_ = auVar54._0_4_ * auVar50._0_4_;
              auVar67._4_4_ = auVar54._4_4_ * auVar50._4_4_;
              auVar67._8_4_ = auVar54._8_4_ * auVar50._8_4_;
              auVar67._12_4_ = auVar54._12_4_ * auVar50._12_4_;
              auVar50 = vsubps_avx(auVar67,auVar79);
              auVar54 = vshufps_avx(auVar50,auVar50,0xc9);
              auVar50 = vdpps_avx(auVar65,auVar65,0x7f);
              fVar127 = auVar50._0_4_;
              auVar53 = ZEXT416((uint)fVar127);
              auVar49 = vrsqrtss_avx(auVar53,auVar53);
              fVar63 = auVar49._0_4_;
              auVar49 = vdpps_avx(auVar65,auVar81,0x7f);
              auVar52 = ZEXT416((uint)(fVar63 * 1.5 - fVar127 * 0.5 * fVar63 * fVar63 * fVar63));
              auVar52 = vshufps_avx(auVar52,auVar52,0);
              fVar63 = auVar52._0_4_ * auVar65._0_4_;
              fVar72 = auVar52._4_4_ * auVar65._4_4_;
              fVar73 = auVar52._8_4_ * auVar65._8_4_;
              fVar74 = auVar52._12_4_ * auVar65._12_4_;
              auVar50 = vshufps_avx(auVar50,auVar50,0);
              auVar104._0_4_ = auVar50._0_4_ * auVar81._0_4_;
              auVar104._4_4_ = auVar50._4_4_ * auVar81._4_4_;
              auVar104._8_4_ = auVar50._8_4_ * auVar81._8_4_;
              auVar104._12_4_ = auVar50._12_4_ * auVar81._12_4_;
              auVar50 = vshufps_avx(auVar49,auVar49,0);
              auVar93._0_4_ = auVar50._0_4_ * auVar65._0_4_;
              auVar93._4_4_ = auVar50._4_4_ * auVar65._4_4_;
              auVar93._8_4_ = auVar50._8_4_ * auVar65._8_4_;
              auVar93._12_4_ = auVar50._12_4_ * auVar65._12_4_;
              auVar66 = vsubps_avx(auVar104,auVar93);
              auVar50 = vrcpss_avx(auVar53,auVar53);
              auVar50 = ZEXT416((uint)(auVar50._0_4_ * (2.0 - fVar127 * auVar50._0_4_)));
              auVar81 = vshufps_avx(auVar50,auVar50,0);
              auVar49 = vdpps_avx(auVar51,auVar51,0x7f);
              auVar50 = vblendps_avx(auVar49,_DAT_01f7aa10,0xe);
              auVar65 = vrsqrtss_avx(auVar50,auVar50);
              fVar127 = auVar65._0_4_;
              auVar65 = ZEXT416((uint)(fVar127 * 1.5 -
                                      auVar49._0_4_ * 0.5 * fVar127 * fVar127 * fVar127));
              auVar53 = vshufps_avx(auVar65,auVar65,0);
              fVar127 = auVar51._0_4_ * auVar53._0_4_;
              fVar132 = auVar51._4_4_ * auVar53._4_4_;
              fVar134 = auVar51._8_4_ * auVar53._8_4_;
              fVar136 = auVar51._12_4_ * auVar53._12_4_;
              auVar65 = vdpps_avx(auVar51,auVar54,0x7f);
              auVar55 = vshufps_avx(auVar49,auVar49,0);
              auVar80._0_4_ = auVar55._0_4_ * auVar54._0_4_;
              auVar80._4_4_ = auVar55._4_4_ * auVar54._4_4_;
              auVar80._8_4_ = auVar55._8_4_ * auVar54._8_4_;
              auVar80._12_4_ = auVar55._12_4_ * auVar54._12_4_;
              auVar65 = vshufps_avx(auVar65,auVar65,0);
              auVar54._0_4_ = auVar65._0_4_ * auVar51._0_4_;
              auVar54._4_4_ = auVar65._4_4_ * auVar51._4_4_;
              auVar54._8_4_ = auVar65._8_4_ * auVar51._8_4_;
              auVar54._12_4_ = auVar65._12_4_ * auVar51._12_4_;
              auVar51 = vsubps_avx(auVar80,auVar54);
              auVar50 = vrcpss_avx(auVar50,auVar50);
              auVar50 = ZEXT416((uint)(auVar50._0_4_ * (2.0 - auVar49._0_4_ * auVar50._0_4_)));
              auVar50 = vshufps_avx(auVar50,auVar50,0);
              auVar49 = vshufps_avx(_local_328,_local_328,0xff);
              auVar105._0_4_ = auVar49._0_4_ * fVar63;
              auVar105._4_4_ = auVar49._4_4_ * fVar72;
              auVar105._8_4_ = auVar49._8_4_ * fVar73;
              auVar105._12_4_ = auVar49._12_4_ * fVar74;
              auVar54 = vsubps_avx(_local_328,auVar105);
              auVar65 = vshufps_avx(auVar56,auVar56,0xff);
              auVar68._0_4_ =
                   auVar65._0_4_ * fVar63 +
                   auVar49._0_4_ * auVar52._0_4_ * auVar66._0_4_ * auVar81._0_4_;
              auVar68._4_4_ =
                   auVar65._4_4_ * fVar72 +
                   auVar49._4_4_ * auVar52._4_4_ * auVar66._4_4_ * auVar81._4_4_;
              auVar68._8_4_ =
                   auVar65._8_4_ * fVar73 +
                   auVar49._8_4_ * auVar52._8_4_ * auVar66._8_4_ * auVar81._8_4_;
              auVar68._12_4_ =
                   auVar65._12_4_ * fVar74 +
                   auVar49._12_4_ * auVar52._12_4_ * auVar66._12_4_ * auVar81._12_4_;
              auVar81 = vsubps_avx(auVar56,auVar68);
              local_328._0_4_ = (float)local_328._0_4_ + auVar105._0_4_;
              local_328._4_4_ = (float)local_328._4_4_ + auVar105._4_4_;
              fStack_320 = fStack_320 + auVar105._8_4_;
              fStack_31c = fStack_31c + auVar105._12_4_;
              auVar49 = vshufps_avx(auVar160,auVar160,0xff);
              auVar106._0_4_ = auVar49._0_4_ * fVar127;
              auVar106._4_4_ = auVar49._4_4_ * fVar132;
              auVar106._8_4_ = auVar49._8_4_ * fVar134;
              auVar106._12_4_ = auVar49._12_4_ * fVar136;
              auVar52 = vsubps_avx(auVar160,auVar106);
              auVar65 = vshufps_avx(auVar76,auVar76,0xff);
              auVar55._0_4_ =
                   auVar65._0_4_ * fVar127 +
                   auVar49._0_4_ * auVar53._0_4_ * auVar51._0_4_ * auVar50._0_4_;
              auVar55._4_4_ =
                   auVar65._4_4_ * fVar132 +
                   auVar49._4_4_ * auVar53._4_4_ * auVar51._4_4_ * auVar50._4_4_;
              auVar55._8_4_ =
                   auVar65._8_4_ * fVar134 +
                   auVar49._8_4_ * auVar53._8_4_ * auVar51._8_4_ * auVar50._8_4_;
              auVar55._12_4_ =
                   auVar65._12_4_ * fVar136 +
                   auVar49._12_4_ * auVar53._12_4_ * auVar51._12_4_ * auVar50._12_4_;
              auVar50 = vsubps_avx(auVar76,auVar55);
              local_318._4_4_ = auVar160._4_4_ + auVar106._4_4_;
              local_318._0_4_ = auVar160._0_4_ + auVar106._0_4_;
              fStack_310 = auVar160._8_4_ + auVar106._8_4_;
              fStack_30c = auVar160._12_4_ + auVar106._12_4_;
              auVar56._0_4_ = auVar54._0_4_ + auVar81._0_4_ * 0.33333334;
              auVar56._4_4_ = auVar54._4_4_ + auVar81._4_4_ * 0.33333334;
              auVar56._8_4_ = auVar54._8_4_ + auVar81._8_4_ * 0.33333334;
              auVar56._12_4_ = auVar54._12_4_ + auVar81._12_4_ * 0.33333334;
              auVar81._0_4_ = auVar50._0_4_ * 0.33333334;
              auVar81._4_4_ = auVar50._4_4_ * 0.33333334;
              auVar81._8_4_ = auVar50._8_4_ * 0.33333334;
              auVar81._12_4_ = auVar50._12_4_ * 0.33333334;
              auVar65 = vsubps_avx(auVar52,auVar81);
              auVar50 = vshufps_avx(auVar65,auVar65,0);
              auVar49 = vshufps_avx(auVar65,auVar65,0x55);
              auStack_108 = vshufps_avx(auVar65,auVar65,0xaa);
              auVar65 = vshufps_avx(auVar52,auVar52,0);
              auVar81 = vshufps_avx(auVar52,auVar52,0x55);
              auVar51 = vshufps_avx(auVar52,auVar52,0xaa);
              fStack_188 = (float)bezier_basis0._3960_8_;
              fStack_184 = SUB84(bezier_basis0._3960_8_,4);
              fStack_180 = (float)bezier_basis0._3968_8_;
              fVar111 = auVar65._0_4_;
              fVar116 = auVar65._4_4_;
              fVar117 = auVar65._8_4_;
              fVar124 = auVar65._12_4_;
              fVar96 = auVar81._0_4_;
              fVar97 = auVar81._4_4_;
              fVar98 = auVar81._8_4_;
              fVar100 = auVar81._12_4_;
              fVar109 = auVar51._0_4_;
              fVar99 = auVar51._4_4_;
              fVar108 = auVar51._8_4_;
              fVar110 = auVar51._12_4_;
              fStack_238 = (float)bezier_basis0._2804_8_;
              fStack_234 = SUB84(bezier_basis0._2804_8_,4);
              fStack_230 = (float)bezier_basis0._2812_8_;
              fVar125 = auVar50._0_4_;
              fVar126 = auVar50._4_4_;
              fVar128 = auVar50._8_4_;
              fVar133 = auVar50._12_4_;
              fVar135 = auVar49._0_4_;
              fVar137 = auVar49._4_4_;
              fVar141 = auVar49._8_4_;
              fVar87 = auStack_108._0_4_;
              fVar88 = auStack_108._4_4_;
              fVar89 = auStack_108._8_4_;
              auVar50 = vshufps_avx(auVar56,auVar56,0);
              local_228._0_4_ = (undefined4)bezier_basis0._1632_8_;
              local_228._4_4_ = SUB84(bezier_basis0._1632_8_,4);
              fStack_220 = (float)bezier_basis0._1640_8_;
              fStack_21c = SUB84(bezier_basis0._1640_8_,4);
              fStack_218 = (float)bezier_basis0._1648_8_;
              fStack_214 = SUB84(bezier_basis0._1648_8_,4);
              fStack_210 = (float)bezier_basis0._1656_8_;
              fVar146 = auVar50._0_4_;
              fVar150 = auVar50._4_4_;
              fVar152 = auVar50._8_4_;
              fVar136 = fVar133 + 0.0 + 0.0;
              auVar65 = vshufps_avx(auVar56,auVar56,0x55);
              fVar154 = auVar65._0_4_;
              fVar157 = auVar65._4_4_;
              fVar158 = auVar65._8_4_;
              auVar81 = vshufps_avx(auVar56,auVar56,0xaa);
              fVar159 = auVar81._0_4_;
              fVar162 = auVar81._4_4_;
              fVar163 = auVar81._8_4_;
              auVar51 = vshufps_avx(auVar54,auVar54,0);
              local_2a8 = (float)bezier_basis0._476_8_;
              fStack_2a4 = SUB84(bezier_basis0._476_8_,4);
              fStack_2a0 = (float)bezier_basis0._484_8_;
              fStack_29c = SUB84(bezier_basis0._484_8_,4);
              fStack_298 = (float)bezier_basis0._492_8_;
              fStack_294 = SUB84(bezier_basis0._492_8_,4);
              fStack_290 = (float)bezier_basis0._500_8_;
              fVar63 = auVar51._0_4_;
              fVar73 = auVar51._4_4_;
              fVar127 = auVar51._8_4_;
              fVar134 = auVar51._12_4_;
              auVar174._0_4_ =
                   local_2a8 * fVar63 +
                   fVar146 * (float)local_228._0_4_ + fVar125 * local_248 + fVar111 * local_198;
              auVar174._4_4_ =
                   fStack_2a4 * fVar73 +
                   fVar150 * (float)local_228._4_4_ + fVar126 * fStack_244 + fVar116 * fStack_194;
              auVar174._8_4_ =
                   fStack_2a0 * fVar127 +
                   fVar152 * fStack_220 + fVar128 * fStack_240 + fVar117 * fStack_190;
              auVar174._12_4_ =
                   fStack_29c * fVar134 +
                   auVar50._12_4_ * fStack_21c + fVar133 * fStack_23c + fVar124 * fStack_18c;
              auVar174._16_4_ =
                   fStack_298 * fVar63 +
                   fVar146 * fStack_218 + fVar125 * fStack_238 + fVar111 * fStack_188;
              auVar174._20_4_ =
                   fStack_294 * fVar73 +
                   fVar150 * fStack_214 + fVar126 * fStack_234 + fVar116 * fStack_184;
              auVar174._24_4_ =
                   fStack_290 * fVar127 +
                   fVar152 * fStack_210 + fVar128 * fStack_230 + fVar117 * fStack_180;
              auVar174._28_4_ = fVar136 + 0.0;
              auVar51 = vshufps_avx(auVar54,auVar54,0x55);
              fVar72 = auVar51._0_4_;
              fVar74 = auVar51._4_4_;
              fVar132 = auVar51._8_4_;
              auVar139._0_4_ =
                   fVar154 * (float)local_228._0_4_ + fVar135 * local_248 + fVar96 * local_198 +
                   local_2a8 * fVar72;
              auVar139._4_4_ =
                   fVar157 * (float)local_228._4_4_ + fVar137 * fStack_244 + fVar97 * fStack_194 +
                   fStack_2a4 * fVar74;
              auVar139._8_4_ =
                   fVar158 * fStack_220 + fVar141 * fStack_240 + fVar98 * fStack_190 +
                   fStack_2a0 * fVar132;
              auVar139._12_4_ =
                   auVar65._12_4_ * fStack_21c + auVar49._12_4_ * fStack_23c + fVar100 * fStack_18c
                   + fStack_29c * auVar51._12_4_;
              auVar139._16_4_ =
                   fVar154 * fStack_218 + fVar135 * fStack_238 + fVar96 * fStack_188 +
                   fStack_298 * fVar72;
              auVar139._20_4_ =
                   fVar157 * fStack_214 + fVar137 * fStack_234 + fVar97 * fStack_184 +
                   fStack_294 * fVar74;
              auVar139._24_4_ =
                   fVar158 * fStack_210 + fVar141 * fStack_230 + fVar98 * fStack_180 +
                   fStack_290 * fVar132;
              auVar139._28_4_ = fVar133 + 0.0 + 0.0 + fVar136;
              auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
              fVar170 = auVar54._0_4_;
              fVar172 = auVar54._4_4_;
              fVar173 = auVar54._8_4_;
              auVar165._0_4_ =
                   fVar170 * local_2a8 +
                   fVar109 * local_198 + fVar87 * local_248 + fVar159 * (float)local_228._0_4_;
              auVar165._4_4_ =
                   fVar172 * fStack_2a4 +
                   fVar99 * fStack_194 + fVar88 * fStack_244 + fVar162 * (float)local_228._4_4_;
              auVar165._8_4_ =
                   fVar173 * fStack_2a0 +
                   fVar108 * fStack_190 + fVar89 * fStack_240 + fVar163 * fStack_220;
              auVar165._12_4_ =
                   auVar54._12_4_ * fStack_29c +
                   fVar110 * fStack_18c + auStack_108._12_4_ * fStack_23c +
                   auVar81._12_4_ * fStack_21c;
              auVar165._16_4_ =
                   fVar170 * fStack_298 +
                   fVar109 * fStack_188 + fVar87 * fStack_238 + fVar159 * fStack_218;
              auVar165._20_4_ =
                   fVar172 * fStack_294 +
                   fVar99 * fStack_184 + fVar88 * fStack_234 + fVar162 * fStack_214;
              auVar165._24_4_ =
                   fVar173 * fStack_290 +
                   fVar108 * fStack_180 + fVar89 * fStack_230 + fVar163 * fStack_210;
              auVar165._28_4_ = 0;
              local_d8 = (float)bezier_basis0._7412_8_;
              fStack_d4 = SUB84(bezier_basis0._7412_8_,4);
              fStack_d0 = (float)bezier_basis0._7420_8_;
              fStack_cc = SUB84(bezier_basis0._7420_8_,4);
              fStack_c8 = (float)bezier_basis0._7428_8_;
              fStack_c4 = SUB84(bezier_basis0._7428_8_,4);
              fStack_c0 = (float)bezier_basis0._7436_8_;
              local_1b8 = (float)bezier_basis0._6256_8_;
              fStack_1b4 = SUB84(bezier_basis0._6256_8_,4);
              fStack_1b0 = (float)bezier_basis0._6264_8_;
              fStack_1ac = SUB84(bezier_basis0._6264_8_,4);
              fStack_1a8 = (float)bezier_basis0._6272_8_;
              fStack_1a4 = SUB84(bezier_basis0._6272_8_,4);
              fStack_1a0 = (float)bezier_basis0._6280_8_;
              fStack_19c = SUB84(bezier_basis0._6280_8_,4);
              fVar136 = fVar124 + fVar124 + 0.0;
              local_1e8 = (float)bezier_basis0._5100_8_;
              fStack_1e0 = (float)bezier_basis0._5108_8_;
              fStack_1dc = SUB84(bezier_basis0._5108_8_,4);
              fStack_1d8 = (float)bezier_basis0._5116_8_;
              fStack_1d4 = SUB84(bezier_basis0._5116_8_,4);
              fStack_1d0 = (float)bezier_basis0._5124_8_;
              auVar83._0_4_ =
                   fVar63 * local_1e8 +
                   fVar146 * local_1b8 + local_d8 * fVar125 + fVar111 * local_f8;
              auVar83._4_4_ =
                   fVar73 * fVar47 +
                   fVar150 * fStack_1b4 + fStack_d4 * fVar126 + fVar116 * fStack_f4;
              auVar83._8_4_ =
                   fVar127 * fStack_1e0 +
                   fVar152 * fStack_1b0 + fStack_d0 * fVar128 + fVar117 * fStack_f0;
              auVar83._12_4_ =
                   fVar134 * fStack_1dc +
                   auVar50._12_4_ * fStack_1ac + fStack_cc * fVar133 + fVar124 * fStack_ec;
              auVar83._16_4_ =
                   fVar63 * fStack_1d8 +
                   fVar146 * fStack_1a8 + fStack_c8 * fVar125 + fVar111 * fStack_e8;
              auVar83._20_4_ =
                   fVar73 * fStack_1d4 +
                   fVar150 * fStack_1a4 + fStack_c4 * fVar126 + fVar116 * fStack_e4;
              auVar83._24_4_ =
                   fVar127 * fStack_1d0 +
                   fVar152 * fStack_1a0 + fStack_c0 * fVar128 + fVar117 * fStack_e0;
              auVar83._28_4_ = fVar134 + fVar136;
              auVar59._0_4_ =
                   fVar72 * local_1e8 + fVar154 * local_1b8 + fVar135 * local_d8 + fVar96 * local_f8
              ;
              auVar59._4_4_ =
                   fVar74 * fVar47 + fVar157 * fStack_1b4 + fVar137 * fStack_d4 + fVar97 * fStack_f4
              ;
              auVar59._8_4_ =
                   fVar132 * fStack_1e0 +
                   fVar158 * fStack_1b0 + fVar141 * fStack_d0 + fVar98 * fStack_f0;
              auVar59._12_4_ =
                   auVar51._12_4_ * fStack_1dc +
                   auVar65._12_4_ * fStack_1ac + auVar49._12_4_ * fStack_cc + fVar100 * fStack_ec;
              auVar59._16_4_ =
                   fVar72 * fStack_1d8 +
                   fVar154 * fStack_1a8 + fVar135 * fStack_c8 + fVar96 * fStack_e8;
              auVar59._20_4_ =
                   fVar74 * fStack_1d4 +
                   fVar157 * fStack_1a4 + fVar137 * fStack_c4 + fVar97 * fStack_e4;
              auVar59._24_4_ =
                   fVar132 * fStack_1d0 +
                   fVar158 * fStack_1a0 + fVar141 * fStack_c0 + fVar98 * fStack_e0;
              auVar59._28_4_ = fStack_19c + fVar124 + fVar124 + fVar100;
              auVar94._0_4_ =
                   fVar170 * local_1e8 +
                   fVar159 * local_1b8 + local_d8 * fVar87 + fVar109 * local_f8;
              auVar94._4_4_ =
                   fVar172 * fVar47 + fVar162 * fStack_1b4 + fStack_d4 * fVar88 + fVar99 * fStack_f4
              ;
              auVar94._8_4_ =
                   fVar173 * fStack_1e0 +
                   fVar163 * fStack_1b0 + fStack_d0 * fVar89 + fVar108 * fStack_f0;
              auVar94._12_4_ =
                   auVar54._12_4_ * fStack_1dc +
                   auVar81._12_4_ * fStack_1ac +
                   fStack_cc * auStack_108._12_4_ + fVar110 * fStack_ec;
              auVar94._16_4_ =
                   fVar170 * fStack_1d8 +
                   fVar159 * fStack_1a8 + fStack_c8 * fVar87 + fVar109 * fStack_e8;
              auVar94._20_4_ =
                   fVar172 * fStack_1d4 +
                   fVar162 * fStack_1a4 + fStack_c4 * fVar88 + fVar99 * fStack_e4;
              auVar94._24_4_ =
                   fVar173 * fStack_1d0 +
                   fVar163 * fStack_1a0 + fStack_c0 * fVar89 + fVar108 * fStack_e0;
              auVar94._28_4_ = fVar136 + fVar124 + fVar124 + fVar110;
              auVar9 = vblendps_avx(auVar83,ZEXT832(0) << 0x20,1);
              auVar10 = vblendps_avx(auVar59,ZEXT832(0) << 0x20,1);
              auVar144 = ZEXT832(0) << 0x20;
              auVar140 = vblendps_avx(auVar94,auVar144,1);
              auVar122._4_4_ = auVar9._4_4_ * 0.055555556;
              auVar122._0_4_ = auVar9._0_4_ * 0.055555556;
              auVar122._8_4_ = auVar9._8_4_ * 0.055555556;
              auVar122._12_4_ = auVar9._12_4_ * 0.055555556;
              auVar122._16_4_ = auVar9._16_4_ * 0.055555556;
              auVar122._20_4_ = auVar9._20_4_ * 0.055555556;
              auVar122._24_4_ = auVar9._24_4_ * 0.055555556;
              auVar122._28_4_ = auVar9._28_4_;
              auVar9._4_4_ = auVar10._4_4_ * 0.055555556;
              auVar9._0_4_ = auVar10._0_4_ * 0.055555556;
              auVar9._8_4_ = auVar10._8_4_ * 0.055555556;
              auVar9._12_4_ = auVar10._12_4_ * 0.055555556;
              auVar9._16_4_ = auVar10._16_4_ * 0.055555556;
              auVar9._20_4_ = auVar10._20_4_ * 0.055555556;
              auVar9._24_4_ = auVar10._24_4_ * 0.055555556;
              auVar9._28_4_ = auVar10._28_4_;
              auVar10._4_4_ = auVar140._4_4_ * 0.055555556;
              auVar10._0_4_ = auVar140._0_4_ * 0.055555556;
              auVar10._8_4_ = auVar140._8_4_ * 0.055555556;
              auVar10._12_4_ = auVar140._12_4_ * 0.055555556;
              auVar10._16_4_ = auVar140._16_4_ * 0.055555556;
              auVar10._20_4_ = auVar140._20_4_ * 0.055555556;
              auVar10._24_4_ = auVar140._24_4_ * 0.055555556;
              auVar10._28_4_ = auVar140._28_4_;
              auVar122 = vsubps_avx(auVar174,auVar122);
              auVar14 = vsubps_avx(auVar139,auVar9);
              auVar15 = vsubps_avx(auVar165,auVar10);
              auVar9 = vblendps_avx(auVar83,auVar144,0x80);
              auVar10 = vblendps_avx(auVar59,auVar144,0x80);
              auVar140 = vblendps_avx(auVar94,auVar144,0x80);
              auVar84._0_4_ = auVar174._0_4_ + auVar9._0_4_ * 0.055555556;
              auVar84._4_4_ = auVar174._4_4_ + auVar9._4_4_ * 0.055555556;
              auVar84._8_4_ = auVar174._8_4_ + auVar9._8_4_ * 0.055555556;
              auVar84._12_4_ = auVar174._12_4_ + auVar9._12_4_ * 0.055555556;
              auVar84._16_4_ = auVar174._16_4_ + auVar9._16_4_ * 0.055555556;
              auVar84._20_4_ = auVar174._20_4_ + auVar9._20_4_ * 0.055555556;
              auVar84._24_4_ = auVar174._24_4_ + auVar9._24_4_ * 0.055555556;
              auVar84._28_4_ = auVar174._28_4_ + auVar9._28_4_;
              auVar60._0_4_ = auVar139._0_4_ + auVar10._0_4_ * 0.055555556;
              auVar60._4_4_ = auVar139._4_4_ + auVar10._4_4_ * 0.055555556;
              auVar60._8_4_ = auVar139._8_4_ + auVar10._8_4_ * 0.055555556;
              auVar60._12_4_ = auVar139._12_4_ + auVar10._12_4_ * 0.055555556;
              auVar60._16_4_ = auVar139._16_4_ + auVar10._16_4_ * 0.055555556;
              auVar60._20_4_ = auVar139._20_4_ + auVar10._20_4_ * 0.055555556;
              auVar60._24_4_ = auVar139._24_4_ + auVar10._24_4_ * 0.055555556;
              auVar60._28_4_ = auVar139._28_4_ + auVar10._28_4_;
              auVar95._0_4_ = auVar165._0_4_ + auVar140._0_4_ * 0.055555556;
              auVar95._4_4_ = auVar165._4_4_ + auVar140._4_4_ * 0.055555556;
              auVar95._8_4_ = auVar165._8_4_ + auVar140._8_4_ * 0.055555556;
              auVar95._12_4_ = auVar165._12_4_ + auVar140._12_4_ * 0.055555556;
              auVar95._16_4_ = auVar165._16_4_ + auVar140._16_4_ * 0.055555556;
              auVar95._20_4_ = auVar165._20_4_ + auVar140._20_4_ * 0.055555556;
              auVar95._24_4_ = auVar165._24_4_ + auVar140._24_4_ * 0.055555556;
              auVar95._28_4_ = auVar140._28_4_ + 0.0;
              auVar69._8_4_ = 0x7f800000;
              auVar69._0_8_ = 0x7f8000007f800000;
              auVar69._12_4_ = 0x7f800000;
              auVar69._16_4_ = 0x7f800000;
              auVar69._20_4_ = 0x7f800000;
              auVar69._24_4_ = 0x7f800000;
              auVar69._28_4_ = 0x7f800000;
              auVar9 = vminps_avx(auVar69,auVar174);
              auVar10 = vminps_avx(auVar69,auVar139);
              auVar140 = vminps_avx(auVar122,auVar84);
              auVar144 = vminps_avx(auVar9,auVar140);
              auVar9 = vminps_avx(auVar14,auVar60);
              auVar13 = vminps_avx(auVar10,auVar9);
              auVar9 = vminps_avx(auVar69,auVar165);
              auVar10 = vminps_avx(auVar15,auVar95);
              auVar59 = vminps_avx(auVar9,auVar10);
              auVar171._0_4_ = (fVar142 + auVar68._0_4_) * 0.33333334 + (float)local_328._0_4_;
              auVar171._4_4_ = (fVar149 + auVar68._4_4_) * 0.33333334 + (float)local_328._4_4_;
              auVar171._8_4_ = (fVar151 + auVar68._8_4_) * 0.33333334 + fStack_320;
              auVar171._12_4_ = (fVar153 + auVar68._12_4_) * 0.33333334 + fStack_31c;
              auVar155._0_4_ = (fVar164 + auVar55._0_4_) * 0.33333334;
              auVar155._4_4_ = (fVar167 + auVar55._4_4_) * 0.33333334;
              auVar155._8_4_ = (fVar168 + auVar55._8_4_) * 0.33333334;
              auVar155._12_4_ = (fVar169 + auVar55._12_4_) * 0.33333334;
              local_118 = vsubps_avx(_local_318,auVar155);
              auVar161._8_4_ = 0xff800000;
              auVar161._0_8_ = 0xff800000ff800000;
              auVar161._12_4_ = 0xff800000;
              auVar161._16_4_ = 0xff800000;
              auVar161._20_4_ = 0xff800000;
              auVar161._24_4_ = 0xff800000;
              auVar161._28_4_ = 0xff800000;
              auVar9 = vmaxps_avx(auVar161,auVar174);
              auVar10 = vmaxps_avx(auVar161,auVar139);
              auVar140 = vmaxps_avx(auVar161,auVar165);
              auVar122 = vmaxps_avx(auVar122,auVar84);
              auVar9 = vmaxps_avx(auVar9,auVar122);
              auVar122 = vmaxps_avx(auVar14,auVar60);
              auVar122 = vmaxps_avx(auVar10,auVar122);
              auVar14 = vmaxps_avx(auVar15,auVar95);
              auVar140 = vmaxps_avx(auVar140,auVar14);
              auVar14 = vshufps_avx(auVar144,auVar144,0xb1);
              auVar14 = vminps_avx(auVar144,auVar14);
              auVar15 = vshufpd_avx(auVar14,auVar14,5);
              auVar14 = vminps_avx(auVar14,auVar15);
              auVar50 = vminps_avx(auVar14._0_16_,auVar14._16_16_);
              auVar14 = vshufps_avx(auVar13,auVar13,0xb1);
              auVar14 = vminps_avx(auVar13,auVar14);
              auVar15 = vshufpd_avx(auVar14,auVar14,5);
              auVar14 = vminps_avx(auVar14,auVar15);
              auVar49 = vminps_avx(auVar14._0_16_,auVar14._16_16_);
              auVar49 = vunpcklps_avx(auVar50,auVar49);
              auVar14 = vshufps_avx(auVar59,auVar59,0xb1);
              auVar14 = vminps_avx(auVar59,auVar14);
              auVar15 = vshufpd_avx(auVar14,auVar14,5);
              auVar14 = vminps_avx(auVar14,auVar15);
              auVar50 = vminps_avx(auVar14._0_16_,auVar14._16_16_);
              auVar50 = vinsertps_avx(auVar49,auVar50,0x28);
              auVar14 = vshufps_avx(auVar9,auVar9,0xb1);
              auVar9 = vmaxps_avx(auVar9,auVar14);
              auVar14 = vshufpd_avx(auVar9,auVar9,5);
              auVar9 = vmaxps_avx(auVar9,auVar14);
              auVar49 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
              auVar9 = vshufps_avx(auVar122,auVar122,0xb1);
              auVar9 = vmaxps_avx(auVar122,auVar9);
              auVar122 = vshufpd_avx(auVar9,auVar9,5);
              auVar9 = vmaxps_avx(auVar9,auVar122);
              auVar65 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
              auVar65 = vunpcklps_avx(auVar49,auVar65);
              auVar9 = vshufps_avx(auVar140,auVar140,0xb1);
              auVar9 = vmaxps_avx(auVar140,auVar9);
              auVar140 = vshufpd_avx(auVar9,auVar9,5);
              auVar9 = vmaxps_avx(auVar9,auVar140);
              auVar49 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
              auVar49 = vinsertps_avx(auVar65,auVar49,0x28);
              auVar65 = vshufps_avx(auVar171,auVar171,0);
              auVar81 = vshufps_avx(auVar171,auVar171,0x55);
              local_138._16_16_ = auVar81;
              local_138._0_16_ = auVar81;
              auVar51 = vshufps_avx(auVar171,auVar171,0xaa);
              local_58._16_16_ = auVar51;
              local_58._0_16_ = auVar51;
              auVar54 = vshufps_avx(local_118,local_118,0);
              auVar52 = vshufps_avx(local_118,local_118,0x55);
              auVar53 = vshufps_avx(local_118,local_118,0xaa);
              auVar55 = vshufps_avx(_local_318,_local_318,0);
              auVar56 = vshufps_avx(_local_318,_local_318,0x55);
              auVar76 = vshufps_avx(_local_318,_local_318,0xaa);
              fVar72 = auVar55._0_4_;
              fVar73 = auVar55._4_4_;
              fVar74 = auVar55._8_4_;
              fVar127 = auVar55._12_4_;
              fVar100 = auVar56._0_4_;
              fVar109 = auVar56._4_4_;
              fVar99 = auVar56._8_4_;
              fVar108 = auVar56._12_4_;
              fVar89 = auVar76._0_4_;
              fVar96 = auVar76._4_4_;
              fVar97 = auVar76._8_4_;
              fVar98 = auVar76._12_4_;
              fVar157 = auVar54._0_4_;
              fVar158 = auVar54._4_4_;
              fVar159 = auVar54._8_4_;
              fVar63 = auVar59._28_4_;
              fVar132 = auVar52._0_4_;
              fVar134 = auVar52._4_4_;
              fVar136 = auVar52._8_4_;
              fVar87 = auVar52._12_4_;
              fVar146 = auVar53._0_4_;
              fVar149 = auVar53._4_4_;
              fVar150 = auVar53._8_4_;
              fVar162 = auVar65._0_4_;
              fVar163 = auVar65._4_4_;
              fVar164 = auVar65._8_4_;
              fVar151 = auVar81._0_4_;
              fVar152 = auVar81._4_4_;
              fVar153 = auVar81._8_4_;
              fVar154 = auVar81._12_4_;
              fVar117 = auVar51._0_4_;
              fVar124 = auVar51._4_4_;
              fVar125 = auVar51._8_4_;
              fVar126 = auVar51._12_4_;
              auVar81 = vshufps_avx(_local_328,_local_328,0);
              fVar110 = auVar81._0_4_;
              fVar111 = auVar81._4_4_;
              fVar116 = auVar81._8_4_;
              auVar148._0_4_ =
                   fVar110 * local_2a8 +
                   fVar162 * (float)local_228._0_4_ + fVar157 * local_248 + fVar72 * local_198;
              auVar148._4_4_ =
                   fVar111 * fStack_2a4 +
                   fVar163 * (float)local_228._4_4_ + fVar158 * fStack_244 + fVar73 * fStack_194;
              auVar148._8_4_ =
                   fVar116 * fStack_2a0 +
                   fVar164 * fStack_220 + fVar159 * fStack_240 + fVar74 * fStack_190;
              auVar148._12_4_ =
                   auVar81._12_4_ * fStack_29c +
                   auVar65._12_4_ * fStack_21c + auVar54._12_4_ * fStack_23c + fVar127 * fStack_18c;
              auVar148._16_4_ =
                   fVar110 * fStack_298 +
                   fVar162 * fStack_218 + fVar157 * fStack_238 + fVar72 * fStack_188;
              auVar148._20_4_ =
                   fVar111 * fStack_294 +
                   fVar163 * fStack_214 + fVar158 * fStack_234 + fVar73 * fStack_184;
              auVar148._24_4_ =
                   fVar116 * fStack_290 +
                   fVar164 * fStack_210 + fVar159 * fStack_230 + fVar74 * fStack_180;
              auVar148._28_4_ = fVar63 + fVar63 + auVar144._28_4_ + 0.0;
              auVar51 = vshufps_avx(_local_328,_local_328,0x55);
              fVar128 = auVar51._0_4_;
              fVar133 = auVar51._4_4_;
              fVar135 = auVar51._8_4_;
              auVar166._0_4_ =
                   fVar128 * local_2a8 +
                   fVar151 * (float)local_228._0_4_ + fVar132 * local_248 + fVar100 * local_198;
              auVar166._4_4_ =
                   fVar133 * fStack_2a4 +
                   fVar152 * (float)local_228._4_4_ + fVar134 * fStack_244 + fVar109 * fStack_194;
              auVar166._8_4_ =
                   fVar135 * fStack_2a0 +
                   fVar153 * fStack_220 + fVar136 * fStack_240 + fVar99 * fStack_190;
              auVar166._12_4_ =
                   auVar51._12_4_ * fStack_29c +
                   fVar154 * fStack_21c + fVar87 * fStack_23c + fVar108 * fStack_18c;
              auVar166._16_4_ =
                   fVar128 * fStack_298 +
                   fVar151 * fStack_218 + fVar132 * fStack_238 + fVar100 * fStack_188;
              auVar166._20_4_ =
                   fVar133 * fStack_294 +
                   fVar152 * fStack_214 + fVar134 * fStack_234 + fVar109 * fStack_184;
              auVar166._24_4_ =
                   fVar135 * fStack_290 +
                   fVar153 * fStack_210 + fVar136 * fStack_230 + fVar99 * fStack_180;
              auVar166._28_4_ = fVar154 + fVar63 + fVar63 + auVar10._28_4_;
              auVar52 = vshufps_avx(_local_328,_local_328,0xaa);
              fVar137 = auVar52._0_4_;
              fVar141 = auVar52._4_4_;
              fVar142 = auVar52._8_4_;
              auVar145._0_4_ =
                   fVar137 * local_2a8 +
                   fVar117 * (float)local_228._0_4_ + fVar146 * local_248 + fVar89 * local_198;
              auVar145._4_4_ =
                   fVar141 * fStack_2a4 +
                   fVar124 * (float)local_228._4_4_ + fVar149 * fStack_244 + fVar96 * fStack_194;
              auVar145._8_4_ =
                   fVar142 * fStack_2a0 +
                   fVar125 * fStack_220 + fVar150 * fStack_240 + fVar97 * fStack_190;
              auVar145._12_4_ =
                   auVar52._12_4_ * fStack_29c +
                   fVar126 * fStack_21c + auVar53._12_4_ * fStack_23c + fVar98 * fStack_18c;
              auVar145._16_4_ =
                   fVar137 * fStack_298 +
                   fVar117 * fStack_218 + fVar146 * fStack_238 + fVar89 * fStack_188;
              auVar145._20_4_ =
                   fVar141 * fStack_294 +
                   fVar124 * fStack_214 + fVar149 * fStack_234 + fVar96 * fStack_184;
              auVar145._24_4_ =
                   fVar142 * fStack_290 +
                   fVar125 * fStack_210 + fVar150 * fStack_230 + fVar97 * fStack_180;
              auVar145._28_4_ = fVar63 + fVar63 + auVar13._28_4_ + 0.0;
              fVar63 = fVar108 + fVar127 + fVar126;
              fVar88 = fVar108 + fVar87 + fVar108;
              auVar61._0_4_ =
                   fVar110 * local_1e8 +
                   fVar162 * local_1b8 + fVar157 * local_d8 + local_f8 * fVar72;
              auVar61._4_4_ =
                   fVar111 * fVar47 +
                   fVar163 * fStack_1b4 + fVar158 * fStack_d4 + fStack_f4 * fVar73;
              auVar61._8_4_ =
                   fVar116 * fStack_1e0 +
                   fVar164 * fStack_1b0 + fVar159 * fStack_d0 + fStack_f0 * fVar74;
              auVar61._12_4_ =
                   auVar81._12_4_ * fStack_1dc +
                   auVar65._12_4_ * fStack_1ac + auVar54._12_4_ * fStack_cc + fStack_ec * fVar127;
              auVar61._16_4_ =
                   fVar110 * fStack_1d8 +
                   fVar162 * fStack_1a8 + fVar157 * fStack_c8 + fStack_e8 * fVar72;
              auVar61._20_4_ =
                   fVar111 * fStack_1d4 +
                   fVar163 * fStack_1a4 + fVar158 * fStack_c4 + fStack_e4 * fVar73;
              auVar61._24_4_ =
                   fVar116 * fStack_1d0 +
                   fVar164 * fStack_1a0 + fVar159 * fStack_c0 + fStack_e0 * fVar74;
              auVar61._28_4_ = fStack_19c + fVar63;
              auVar70._0_4_ =
                   fVar128 * local_1e8 +
                   local_1b8 * fVar151 + fVar132 * local_d8 + local_f8 * fVar100;
              auVar70._4_4_ =
                   fVar133 * fVar47 +
                   fStack_1b4 * fVar152 + fVar134 * fStack_d4 + fStack_f4 * fVar109;
              auVar70._8_4_ =
                   fVar135 * fStack_1e0 +
                   fStack_1b0 * fVar153 + fVar136 * fStack_d0 + fStack_f0 * fVar99;
              auVar70._12_4_ =
                   auVar51._12_4_ * fStack_1dc +
                   fStack_1ac * fVar154 + fVar87 * fStack_cc + fStack_ec * fVar108;
              auVar70._16_4_ =
                   fVar128 * fStack_1d8 +
                   fStack_1a8 * fVar151 + fVar132 * fStack_c8 + fStack_e8 * fVar100;
              auVar70._20_4_ =
                   fVar133 * fStack_1d4 +
                   fStack_1a4 * fVar152 + fVar134 * fStack_c4 + fStack_e4 * fVar109;
              auVar70._24_4_ =
                   fVar135 * fStack_1d0 +
                   fStack_1a0 * fVar153 + fVar136 * fStack_c0 + fStack_e0 * fVar99;
              auVar70._28_4_ = fVar63 + fVar88;
              auVar85._0_4_ =
                   fVar137 * local_1e8 +
                   local_1b8 * fVar117 + fVar146 * local_d8 + local_f8 * fVar89;
              auVar85._4_4_ =
                   fVar141 * fVar47 +
                   fStack_1b4 * fVar124 + fVar149 * fStack_d4 + fStack_f4 * fVar96;
              auVar85._8_4_ =
                   fVar142 * fStack_1e0 +
                   fStack_1b0 * fVar125 + fVar150 * fStack_d0 + fStack_f0 * fVar97;
              auVar85._12_4_ =
                   auVar52._12_4_ * fStack_1dc +
                   fStack_1ac * fVar126 + auVar53._12_4_ * fStack_cc + fStack_ec * fVar98;
              auVar85._16_4_ =
                   fVar137 * fStack_1d8 +
                   fStack_1a8 * fVar117 + fVar146 * fStack_c8 + fStack_e8 * fVar89;
              auVar85._20_4_ =
                   fVar141 * fStack_1d4 +
                   fStack_1a4 * fVar124 + fVar149 * fStack_c4 + fStack_e4 * fVar96;
              auVar85._24_4_ =
                   fVar142 * fStack_1d0 +
                   fStack_1a0 * fVar125 + fVar150 * fStack_c0 + fStack_e0 * fVar97;
              auVar85._28_4_ = fVar88 + fVar108 + fVar98 + fVar108;
              auVar9 = vblendps_avx(auVar61,ZEXT832(0) << 0x20,1);
              auVar10 = vblendps_avx(auVar70,ZEXT832(0) << 0x20,1);
              auVar122 = ZEXT832(0) << 0x20;
              auVar140 = vblendps_avx(auVar85,auVar122,1);
              auVar14._4_4_ = auVar9._4_4_ * 0.055555556;
              auVar14._0_4_ = auVar9._0_4_ * 0.055555556;
              auVar14._8_4_ = auVar9._8_4_ * 0.055555556;
              auVar14._12_4_ = auVar9._12_4_ * 0.055555556;
              auVar14._16_4_ = auVar9._16_4_ * 0.055555556;
              auVar14._20_4_ = auVar9._20_4_ * 0.055555556;
              auVar14._24_4_ = auVar9._24_4_ * 0.055555556;
              auVar14._28_4_ = auVar9._28_4_;
              auVar144._4_4_ = auVar10._4_4_ * 0.055555556;
              auVar144._0_4_ = auVar10._0_4_ * 0.055555556;
              auVar144._8_4_ = auVar10._8_4_ * 0.055555556;
              auVar144._12_4_ = auVar10._12_4_ * 0.055555556;
              auVar144._16_4_ = auVar10._16_4_ * 0.055555556;
              auVar144._20_4_ = auVar10._20_4_ * 0.055555556;
              auVar144._24_4_ = auVar10._24_4_ * 0.055555556;
              auVar144._28_4_ = auVar10._28_4_;
              auVar13._4_4_ = auVar140._4_4_ * 0.055555556;
              auVar13._0_4_ = auVar140._0_4_ * 0.055555556;
              auVar13._8_4_ = auVar140._8_4_ * 0.055555556;
              auVar13._12_4_ = auVar140._12_4_ * 0.055555556;
              auVar13._16_4_ = auVar140._16_4_ * 0.055555556;
              auVar13._20_4_ = auVar140._20_4_ * 0.055555556;
              auVar13._24_4_ = auVar140._24_4_ * 0.055555556;
              auVar13._28_4_ = auVar140._28_4_;
              auVar59 = vsubps_avx(auVar148,auVar14);
              auVar15 = vsubps_avx(auVar166,auVar144);
              auVar60 = vsubps_avx(auVar145,auVar13);
              auVar9 = vblendps_avx(auVar61,auVar122,0x80);
              auVar10 = vblendps_avx(auVar70,auVar122,0x80);
              auVar140 = vblendps_avx(auVar85,auVar122,0x80);
              auVar62._0_4_ = auVar148._0_4_ + auVar9._0_4_ * 0.055555556;
              auVar62._4_4_ = auVar148._4_4_ + auVar9._4_4_ * 0.055555556;
              auVar62._8_4_ = auVar148._8_4_ + auVar9._8_4_ * 0.055555556;
              auVar62._12_4_ = auVar148._12_4_ + auVar9._12_4_ * 0.055555556;
              auVar62._16_4_ = auVar148._16_4_ + auVar9._16_4_ * 0.055555556;
              auVar62._20_4_ = auVar148._20_4_ + auVar9._20_4_ * 0.055555556;
              auVar62._24_4_ = auVar148._24_4_ + auVar9._24_4_ * 0.055555556;
              auVar62._28_4_ = auVar148._28_4_ + auVar9._28_4_;
              auVar71._0_4_ = auVar166._0_4_ + auVar10._0_4_ * 0.055555556;
              auVar71._4_4_ = auVar166._4_4_ + auVar10._4_4_ * 0.055555556;
              auVar71._8_4_ = auVar166._8_4_ + auVar10._8_4_ * 0.055555556;
              auVar71._12_4_ = auVar166._12_4_ + auVar10._12_4_ * 0.055555556;
              auVar71._16_4_ = auVar166._16_4_ + auVar10._16_4_ * 0.055555556;
              auVar71._20_4_ = auVar166._20_4_ + auVar10._20_4_ * 0.055555556;
              auVar71._24_4_ = auVar166._24_4_ + auVar10._24_4_ * 0.055555556;
              auVar71._28_4_ = auVar166._28_4_ + auVar10._28_4_;
              auVar86._0_4_ = auVar145._0_4_ + auVar140._0_4_ * 0.055555556;
              auVar86._4_4_ = auVar145._4_4_ + auVar140._4_4_ * 0.055555556;
              auVar86._8_4_ = auVar145._8_4_ + auVar140._8_4_ * 0.055555556;
              auVar86._12_4_ = auVar145._12_4_ + auVar140._12_4_ * 0.055555556;
              auVar86._16_4_ = auVar145._16_4_ + auVar140._16_4_ * 0.055555556;
              auVar86._20_4_ = auVar145._20_4_ + auVar140._20_4_ * 0.055555556;
              auVar86._24_4_ = auVar145._24_4_ + auVar140._24_4_ * 0.055555556;
              auVar86._28_4_ = auVar145._28_4_ + auVar140._28_4_;
              auVar140._8_4_ = 0x7f800000;
              auVar140._0_8_ = 0x7f8000007f800000;
              auVar140._12_4_ = 0x7f800000;
              auVar140._16_4_ = 0x7f800000;
              auVar140._20_4_ = 0x7f800000;
              auVar140._24_4_ = 0x7f800000;
              auVar140._28_4_ = 0x7f800000;
              auVar9 = vminps_avx(auVar140,auVar148);
              auVar10 = vminps_avx(auVar140,auVar166);
              auVar140 = vminps_avx(auVar140,auVar145);
              auVar122 = vminps_avx(auVar59,auVar62);
              auVar14 = vminps_avx(auVar9,auVar122);
              auVar9 = vminps_avx(auVar15,auVar71);
              auVar144 = vminps_avx(auVar10,auVar9);
              auVar9 = vminps_avx(auVar60,auVar86);
              auVar13 = vminps_avx(auVar140,auVar9);
              auVar9 = vmaxps_avx(auVar59,auVar62);
              auVar156._8_4_ = 0xff800000;
              auVar156._0_8_ = 0xff800000ff800000;
              auVar156._12_4_ = 0xff800000;
              auVar156._16_4_ = 0xff800000;
              auVar156._20_4_ = 0xff800000;
              auVar156._24_4_ = 0xff800000;
              auVar156._28_4_ = 0xff800000;
              auVar10 = vmaxps_avx(auVar156,auVar148);
              auVar9 = vmaxps_avx(auVar10,auVar9);
              auVar10 = vmaxps_avx(auVar15,auVar71);
              auVar140 = vmaxps_avx(auVar156,auVar166);
              auVar10 = vmaxps_avx(auVar140,auVar10);
              auVar140 = vmaxps_avx(auVar60,auVar86);
              auVar122 = vmaxps_avx(auVar156,auVar145);
              auVar140 = vmaxps_avx(auVar122,auVar140);
              auVar122 = vshufps_avx(auVar14,auVar14,0xb1);
              auVar122 = vminps_avx(auVar14,auVar122);
              auVar121._8_4_ = 0xddccb9a2;
              auVar121._0_8_ = 0xddccb9a2ddccb9a2;
              auVar121._12_4_ = 0xddccb9a2;
              auVar123 = ZEXT1664(auVar121);
              auVar14 = vshufpd_avx(auVar122,auVar122,5);
              auVar122 = vminps_avx(auVar122,auVar14);
              auVar65 = vminps_avx(auVar122._0_16_,auVar122._16_16_);
              auVar122 = vshufps_avx(auVar144,auVar144,0xb1);
              auVar122 = vminps_avx(auVar144,auVar122);
              auVar14 = vshufpd_avx(auVar122,auVar122,5);
              auVar122 = vminps_avx(auVar122,auVar14);
              auVar81 = vminps_avx(auVar122._0_16_,auVar122._16_16_);
              auVar81 = vunpcklps_avx(auVar65,auVar81);
              auVar122 = vshufps_avx(auVar13,auVar13,0xb1);
              auVar122 = vminps_avx(auVar13,auVar122);
              auVar14 = vshufpd_avx(auVar122,auVar122,5);
              auVar122 = vminps_avx(auVar122,auVar14);
              auVar65 = vminps_avx(auVar122._0_16_,auVar122._16_16_);
              auVar114._8_4_ = 0x5dccb9a2;
              auVar114._0_8_ = 0x5dccb9a25dccb9a2;
              auVar114._12_4_ = 0x5dccb9a2;
              auVar115 = ZEXT1664(auVar114);
              auVar65 = vinsertps_avx(auVar81,auVar65,0x28);
              auVar81 = vminps_avx(auVar50,auVar65);
              auVar122 = vshufps_avx(auVar9,auVar9,0xb1);
              auVar9 = vmaxps_avx(auVar9,auVar122);
              auVar122 = vshufpd_avx(auVar9,auVar9,5);
              auVar9 = vmaxps_avx(auVar9,auVar122);
              auVar50 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
              auVar9 = vshufps_avx(auVar10,auVar10,0xb1);
              auVar9 = vmaxps_avx(auVar10,auVar9);
              auVar10 = vshufpd_avx(auVar9,auVar9,5);
              auVar9 = vmaxps_avx(auVar9,auVar10);
              auVar65 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
              auVar65 = vunpcklps_avx(auVar50,auVar65);
              auVar9 = vshufps_avx(auVar140,auVar140,0xb1);
              auVar9 = vmaxps_avx(auVar140,auVar9);
              auVar10 = vshufpd_avx(auVar9,auVar9,5);
              auVar9 = vmaxps_avx(auVar9,auVar10);
              auVar50 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
              auVar50 = vinsertps_avx(auVar65,auVar50,0x28);
              auVar49 = vmaxps_avx(auVar49,auVar50);
              auVar50 = vcmpps_avx(auVar81,auVar121,6);
              auVar49 = vcmpps_avx(auVar49,auVar114,1);
              auVar50 = vandps_avx(auVar49,auVar50);
              uVar37 = vmovmskps_avx(auVar50);
              if ((~(byte)uVar37 & 7) != 0) {
                auVar107 = ZEXT864(0) << 0x20;
                auVar131 = ZEXT864(0) << 0x20;
                goto LAB_0121cc99;
              }
              uVar42 = uVar42 + 1;
              lVar43 = lVar43 + 0x38;
              auVar49 = ZEXT816(0) << 0x20;
              auVar107 = ZEXT864(0) << 0x20;
              auVar131 = ZEXT864(0) << 0x20;
            } while (uVar42 <= (ulong)(long)(int)auVar64._0_4_);
            auVar50._8_8_ = 0;
            auVar50._0_4_ =
                 (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 super_Geometry.time_range.lower;
            auVar50._4_4_ =
                 (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 super_Geometry.time_range.upper;
            _fStack_238 = bezier_basis0._2804_8_;
            _fStack_230 = bezier_basis0._2812_8_;
            _fStack_218 = bezier_basis0._1648_8_;
            _fStack_210 = bezier_basis0._1656_8_;
            _fStack_1e0 = bezier_basis0._5108_8_;
            _fStack_1d8 = bezier_basis0._5116_8_;
            _fStack_1d0 = bezier_basis0._5124_8_;
            _local_1b8 = bezier_basis0._6256_8_;
            _fStack_1b0 = bezier_basis0._6264_8_;
            _fStack_1a8 = bezier_basis0._6272_8_;
            _fStack_1a0 = bezier_basis0._6280_8_;
            _fStack_188 = bezier_basis0._3960_8_;
            _fStack_180 = bezier_basis0._3968_8_;
            _local_d8 = bezier_basis0._7412_8_;
            _fStack_d0 = bezier_basis0._7420_8_;
            _fStack_c8 = bezier_basis0._7428_8_;
            _fStack_c0 = bezier_basis0._7436_8_;
            fStack_1e4 = fVar47;
            unique0x1000db4a = auVar20;
          }
          auVar57 = vmovshdup_avx(auVar50);
          fVar48 = auVar50._0_4_;
          local_248 = auVar57._0_4_ - fVar48;
          local_1e8 = ((float)local_1f8._0_4_ - fVar48) / local_248;
          local_248 = ((float)local_208._0_4_ - fVar48) / local_248;
          fVar48 = fVar2 * local_1e8;
          fVar47 = fVar2 * local_248;
          auVar64 = vroundss_avx(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48),9);
          auVar65 = vroundss_avx(ZEXT416((uint)fVar47),ZEXT416((uint)fVar47),10);
          auVar57 = vmaxss_avx(auVar64,auVar49);
          local_228._0_4_ = auVar57._0_4_;
          auVar50 = vminss_avx(auVar65,ZEXT416((uint)fVar2));
          iVar40 = (int)auVar57._0_4_;
          fVar63 = auVar50._0_4_;
          local_1c8.primID = &local_250;
          uVar4 = (int)auVar64._0_4_;
          if ((int)auVar64._0_4_ < 0) {
            uVar4 = 0xffffffff;
          }
          iVar39 = (int)fVar2 + 1;
          if ((int)auVar65._0_4_ < (int)fVar2 + 1) {
            iVar39 = (int)auVar65._0_4_;
          }
          local_250 = uVar45;
          local_1c8.this =
               (CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
                *)this;
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_158.field_1,&local_1c8,(long)iVar40);
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_178.field_1,&local_1c8,(long)(int)fVar63);
          fVar48 = fVar48 - (float)local_228._0_4_;
          if (iVar39 - uVar4 == 1) {
            auVar57 = vmaxss_avx(ZEXT416((uint)fVar48),ZEXT816(0) << 0x40);
            auVar50 = vshufps_avx(auVar57,auVar57,0);
            auVar57 = ZEXT416((uint)(1.0 - auVar57._0_4_));
            auVar57 = vshufps_avx(auVar57,auVar57,0);
            auVar143._0_4_ = auVar50._0_4_ * local_178.m128[0] + auVar57._0_4_ * local_158.m128[0];
            auVar143._4_4_ = auVar50._4_4_ * local_178.m128[1] + auVar57._4_4_ * local_158.m128[1];
            auVar143._8_4_ = auVar50._8_4_ * local_178.m128[2] + auVar57._8_4_ * local_158.m128[2];
            auVar143._12_4_ =
                 auVar50._12_4_ * local_178.m128[3] + auVar57._12_4_ * local_158.m128[3];
            auVar147._0_4_ = auVar50._0_4_ * local_168 + auVar57._0_4_ * local_148;
            auVar147._4_4_ = auVar50._4_4_ * fStack_164 + auVar57._4_4_ * fStack_144;
            auVar147._8_4_ = auVar50._8_4_ * fStack_160 + auVar57._8_4_ * fStack_140;
            auVar147._12_4_ = auVar50._12_4_ * fStack_15c + auVar57._12_4_ * fStack_13c;
            auVar57 = vmaxss_avx(ZEXT416((uint)(fVar63 - fVar47)),ZEXT816(0) << 0x40);
            auVar50 = vshufps_avx(auVar57,auVar57,0);
            auVar57 = ZEXT416((uint)(1.0 - auVar57._0_4_));
            auVar57 = vshufps_avx(auVar57,auVar57,0);
            auVar75._0_4_ = auVar57._0_4_ * local_178.m128[0] + auVar50._0_4_ * local_158.m128[0];
            auVar75._4_4_ = auVar57._4_4_ * local_178.m128[1] + auVar50._4_4_ * local_158.m128[1];
            auVar75._8_4_ = auVar57._8_4_ * local_178.m128[2] + auVar50._8_4_ * local_158.m128[2];
            auVar75._12_4_ = auVar57._12_4_ * local_178.m128[3] + auVar50._12_4_ * local_158.m128[3]
            ;
            auVar138._0_4_ = auVar57._0_4_ * local_168 + auVar50._0_4_ * local_148;
            auVar138._4_4_ = auVar57._4_4_ * fStack_164 + auVar50._4_4_ * fStack_144;
            auVar138._8_4_ = auVar57._8_4_ * fStack_160 + auVar50._8_4_ * fStack_140;
            auVar138._12_4_ = auVar57._12_4_ * fStack_15c + auVar50._12_4_ * fStack_13c;
            auVar57 = ZEXT416(0) << 0x20;
            auVar131 = ZEXT464(0) << 0x20;
          }
          else {
            ::anon_func::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_1c8,(long)(iVar40 + 1));
            ::anon_func::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_98.field_1,&local_1c8,(long)((int)fVar63 + -1));
            auVar57 = vmaxss_avx(ZEXT416((uint)fVar48),ZEXT816(0) << 0x40);
            auVar50 = vshufps_avx(auVar57,auVar57,0);
            auVar57 = ZEXT416((uint)(1.0 - auVar57._0_4_));
            auVar57 = vshufps_avx(auVar57,auVar57,0);
            auVar143._0_4_ = auVar50._0_4_ * local_78.m128[0] + auVar57._0_4_ * local_158.m128[0];
            auVar143._4_4_ = auVar50._4_4_ * local_78.m128[1] + auVar57._4_4_ * local_158.m128[1];
            auVar143._8_4_ = auVar50._8_4_ * local_78.m128[2] + auVar57._8_4_ * local_158.m128[2];
            auVar143._12_4_ = auVar50._12_4_ * local_78.m128[3] + auVar57._12_4_ * local_158.m128[3]
            ;
            auVar147._0_4_ = auVar50._0_4_ * local_68 + auVar57._0_4_ * local_148;
            auVar147._4_4_ = auVar50._4_4_ * fStack_64 + auVar57._4_4_ * fStack_144;
            auVar147._8_4_ = auVar50._8_4_ * fStack_60 + auVar57._8_4_ * fStack_140;
            auVar147._12_4_ = auVar50._12_4_ * fStack_5c + auVar57._12_4_ * fStack_13c;
            auVar57 = vmaxss_avx(ZEXT416((uint)(fVar63 - fVar47)),ZEXT816(0) << 0x40);
            auVar50 = vshufps_avx(auVar57,auVar57,0);
            auVar57 = ZEXT416((uint)(1.0 - auVar57._0_4_));
            auVar57 = vshufps_avx(auVar57,auVar57,0);
            auVar75._0_4_ = auVar50._0_4_ * local_98.m128[0] + auVar57._0_4_ * local_178.m128[0];
            auVar75._4_4_ = auVar50._4_4_ * local_98.m128[1] + auVar57._4_4_ * local_178.m128[1];
            auVar75._8_4_ = auVar50._8_4_ * local_98.m128[2] + auVar57._8_4_ * local_178.m128[2];
            auVar75._12_4_ = auVar50._12_4_ * local_98.m128[3] + auVar57._12_4_ * local_178.m128[3];
            auVar138._0_4_ = auVar50._0_4_ * local_88 + auVar57._0_4_ * local_168;
            auVar138._4_4_ = auVar50._4_4_ * fStack_84 + auVar57._4_4_ * fStack_164;
            auVar138._8_4_ = auVar50._8_4_ * fStack_80 + auVar57._8_4_ * fStack_160;
            auVar138._12_4_ = auVar50._12_4_ * fStack_7c + auVar57._12_4_ * fStack_15c;
            if ((int)(uVar4 + 1) < iVar39) {
              local_1b8 = local_248 - local_1e8;
              itime = (size_t)(uVar4 + 1);
              iVar39 = ~uVar4 + iVar39;
              do {
                _local_228 = auVar138;
                auVar58._0_4_ = ((float)(int)itime / fVar2 - local_1e8) / local_1b8;
                auVar58._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar57 = vshufps_avx(auVar58,auVar58,0);
                local_328._0_4_ = auVar75._0_4_;
                local_328._4_4_ = auVar75._4_4_;
                fStack_320 = auVar75._8_4_;
                fStack_31c = auVar75._12_4_;
                auVar50 = vshufps_avx(ZEXT416((uint)(1.0 - auVar58._0_4_)),
                                      ZEXT416((uint)(1.0 - auVar58._0_4_)),0);
                fVar48 = auVar143._4_4_;
                fVar47 = auVar143._8_4_;
                fVar63 = auVar143._12_4_;
                local_248 = auVar57._0_4_ * (float)local_328._0_4_ + auVar143._0_4_ * auVar50._0_4_;
                fStack_244 = auVar57._4_4_ * (float)local_328._4_4_ + fVar48 * auVar50._4_4_;
                fStack_240 = auVar57._8_4_ * fStack_320 + fVar47 * auVar50._8_4_;
                fStack_23c = auVar57._12_4_ * fStack_31c + fVar63 * auVar50._12_4_;
                fVar72 = auVar147._4_4_;
                fVar73 = auVar147._8_4_;
                fVar74 = auVar147._12_4_;
                local_198 = local_228._0_4_ * auVar57._0_4_ + auVar147._0_4_ * auVar50._0_4_;
                fStack_194 = local_228._4_4_ * auVar57._4_4_ + fVar72 * auVar50._4_4_;
                fStack_190 = local_228._8_4_ * auVar57._8_4_ + fVar73 * auVar50._8_4_;
                fStack_18c = local_228._12_4_ * auVar57._12_4_ + fVar74 * auVar50._12_4_;
                ::anon_func::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_b8.field_1,&local_1c8,itime);
                auVar57 = ZEXT816(0) << 0x40;
                auVar16._4_4_ = fStack_244;
                auVar16._0_4_ = local_248;
                auVar16._8_4_ = fStack_240;
                auVar16._12_4_ = fStack_23c;
                auVar50 = vsubps_avx((undefined1  [16])local_b8,auVar16);
                auVar17._4_4_ = fStack_194;
                auVar17._0_4_ = local_198;
                auVar17._8_4_ = fStack_190;
                auVar17._12_4_ = fStack_18c;
                auVar64 = vsubps_avx(local_a8,auVar17);
                auVar49 = vminps_avx(auVar50,auVar57);
                auVar50 = vmaxps_avx(auVar64,auVar57);
                auVar143._0_4_ = auVar143._0_4_ + auVar49._0_4_;
                auVar143._4_4_ = fVar48 + auVar49._4_4_;
                auVar143._8_4_ = fVar47 + auVar49._8_4_;
                auVar143._12_4_ = fVar63 + auVar49._12_4_;
                auVar75._0_4_ = (float)local_328._0_4_ + auVar49._0_4_;
                auVar75._4_4_ = (float)local_328._4_4_ + auVar49._4_4_;
                auVar75._8_4_ = fStack_320 + auVar49._8_4_;
                auVar75._12_4_ = fStack_31c + auVar49._12_4_;
                auVar147._0_4_ = auVar147._0_4_ + auVar50._0_4_;
                auVar147._4_4_ = fVar72 + auVar50._4_4_;
                auVar147._8_4_ = fVar73 + auVar50._8_4_;
                auVar147._12_4_ = fVar74 + auVar50._12_4_;
                auVar138._0_4_ = (float)local_228._0_4_ + auVar50._0_4_;
                auVar138._4_4_ = (float)local_228._4_4_ + auVar50._4_4_;
                auVar138._8_4_ = fStack_220 + auVar50._8_4_;
                auVar138._12_4_ = fStack_21c + auVar50._12_4_;
                itime = itime + 1;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
            else {
              auVar57 = ZEXT816(0) << 0x40;
            }
            auVar131 = ZEXT1664(auVar57);
            auVar57 = ZEXT816(0) << 0x40;
          }
          auVar107 = ZEXT1664(auVar57);
          auVar57 = vcmpps_avx(auVar143,auVar147,2);
          uVar37 = vmovmskps_avx(auVar57);
          auVar115 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          auVar123 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar57 = _local_228;
          uVar36 = _local_1e8;
          if ((~(byte)uVar37 & 7) == 0) {
            auVar50 = vcmpps_avx(auVar75,auVar138,2);
            uVar37 = vmovmskps_avx(auVar50);
            if ((~(byte)uVar37 & 7) == 0) {
              auVar50 = vminps_avx(auVar143,auVar75);
              aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                       vinsertps_avx(auVar50,ZEXT416(geomID),0x30);
              auVar50 = vmaxps_avx(auVar147,auVar138);
              aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                       vinsertps_avx(auVar50,ZEXT416((uint)uVar45),0x30);
              auVar82._0_4_ = aVar11.x + aVar12.x;
              auVar82._4_4_ = aVar11.y + aVar12.y;
              auVar82._8_4_ = aVar11.z + aVar12.z;
              auVar82._12_4_ = aVar11.field_3.w + aVar12.field_3.w;
              local_2e8 = vminps_avx(local_2e8,(undefined1  [16])aVar11);
              local_2d8 = vmaxps_avx(local_2d8,(undefined1  [16])aVar12);
              local_2b8 = vminps_avx(local_2b8,auVar82);
              local_2c8 = vmaxps_avx(local_2c8,auVar82);
              local_300 = local_300 + 1;
              prims[local_2f0].lower.field_0.field_1 = aVar11;
              prims[local_2f0].upper.field_0.field_1 = aVar12;
              local_2f0 = local_2f0 + 1;
            }
          }
        }
LAB_0121cc99:
        _local_1e8 = uVar36;
        _local_228 = auVar57;
        uVar45 = uVar45 + 1;
      } while (uVar45 < r->_end);
    }
    else {
      local_300 = 0;
      local_2d8._8_4_ = 0xff800000;
      local_2d8._0_8_ = 0xff800000ff800000;
      local_2d8._12_4_ = 0xff800000;
      local_2e8._8_4_ = 0x7f800000;
      local_2e8._0_8_ = 0x7f8000007f800000;
      local_2e8._12_4_ = 0x7f800000;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_2e8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_2e8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_2d8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_2d8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_2b8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_2b8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_2c8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_2c8._8_8_;
    __return_storage_ptr__->end = local_300;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }